

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * ReportCritical(ExpressionEvalContext *ctx,char *msg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_d8;
  void **local_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
    local_c8 = local_b8;
    local_d0 = &args[0].overflow_arg_area;
    local_d8 = 0x3000000010;
    local_a8 = in_RDX;
    local_a0 = in_RCX;
    local_98 = in_R8;
    local_90 = in_R9;
    vsnprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,msg,&local_d8);
    ctx->errorBuf[ctx->errorBufSize - 1] = '\0';
  }
  ctx->errorCritical = true;
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* ReportCritical(ExpressionEvalContext &ctx, const char *msg, ...)
{
	if(ctx.errorBuf && ctx.errorBufSize)
	{
		va_list args;
		va_start(args, msg);

		vsnprintf(ctx.errorBuf, ctx.errorBufSize, msg, args);

		va_end(args);

		ctx.errorBuf[ctx.errorBufSize - 1] = '\0';
	}

	ctx.errorCritical = true;

	return NULL;
}